

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  float *in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  pmr::polymorphic_allocator<float>::deallocate_object<float>
            (&in_RDI->alloc,in_stack_ffffffffffffffe8,0x3fd39c);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }